

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

ostream * __thiscall
covenant::DFA<covenant::Sym>::print_dot(DFA<covenant::Sym> *this,ostream *o,string *label)

{
  int iVar1;
  const_reference cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  void *this_00;
  ulong uVar6;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  shared_ptr<covenant::TerminalFactory> *psVar11;
  const_reference pvVar12;
  string *in_RDX;
  ostream *in_RSI;
  long in_RDI;
  uint ei;
  uint ti;
  uint ss;
  int i;
  DFA<covenant::Sym> *in_stack_ffffffffffffff38;
  shared_ptr<covenant::TerminalFactory> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff58;
  string *psVar13;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TerminalFactory *in_stack_ffffffffffffffa8;
  string local_50 [36];
  int local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  ostream *local_10;
  
  print_dot::sfa_key = print_dot::sfa_key + 1;
  local_10 = in_RSI;
  poVar5 = std::operator<<(in_RSI,"digraph ");
  poVar5 = std::operator<<(poVar5,"sfa_");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,print_dot::sfa_key);
  poVar5 = std::operator<<(poVar5,"{");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"label = \"");
  poVar5 = std::operator<<(poVar5,in_RDX);
  poVar5 = std::operator<<(poVar5,"\";");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"rankdir=LR;");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_10,"node [shape = point ] qi;");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    iVar4 = nStates((DFA<covenant::Sym> *)0x21a114);
    if (iVar4 <= iVar1) break;
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (cVar2) {
      poVar5 = std::operator<<(local_10,"node [shape = doublecircle ] ");
      poVar5 = std::operator<<(poVar5,"q");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
      poVar5 = std::operator<<(poVar5,";");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<(local_10,"node [shape = circle ] ");
      poVar5 = std::operator<<(poVar5,"q");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
      poVar5 = std::operator<<(poVar5,";");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    local_1c = local_1c + 1;
  }
  poVar5 = std::operator<<(local_10,"qi");
  poVar5 = std::operator<<(poVar5," -> ");
  poVar5 = std::operator<<(poVar5,"q");
  local_20 = (uint)startState(in_stack_ffffffffffffff38);
  this_00 = (void *)std::ostream::operator<<(poVar5,local_20);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_24 = 0;
  while( true ) {
    uVar6 = (ulong)local_24;
    sVar7 = std::
            vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
            ::size((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                    *)(in_RDI + 0x18));
    if (sVar7 <= uVar6) break;
    local_28 = 0;
    while( true ) {
      uVar6 = (ulong)local_28;
      pvVar8 = std::
               vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             *)(in_RDI + 0x18),(ulong)local_24);
      sVar7 = std::
              vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
              ::size(pvVar8);
      if (sVar7 <= uVar6) break;
      poVar5 = std::operator<<(local_10,"q");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_24);
      poVar5 = std::operator<<(poVar5," -> ");
      poVar5 = std::operator<<(poVar5,"q");
      pvVar8 = std::
               vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             *)(in_RDI + 0x18),(ulong)local_24);
      pvVar9 = std::
               vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
               ::operator[](pvVar8,(ulong)local_28);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->dest);
      std::operator<<(poVar5," [label=\"");
      pvVar8 = std::
               vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             *)(in_RDI + 0x18),(ulong)local_24);
      pvVar9 = std::
               vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
               ::operator[](pvVar8,(ulong)local_28);
      bVar3 = Sym::isVar(&pvVar9->val);
      poVar5 = local_10;
      if (bVar3) {
        pvVar8 = std::
                 vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                 ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               *)(in_RDI + 0x18),(ulong)local_24);
        pvVar9 = std::
                 vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                 ::operator[](pvVar8,(ulong)local_28);
        local_2c = (pvVar9->val).x;
        covenant::operator<<
                  ((ostream *)in_stack_ffffffffffffff38,
                   (Sym)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      }
      else {
        boost::shared_ptr<covenant::TerminalFactory>::operator->(in_stack_ffffffffffffff40);
        pvVar8 = std::
                 vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                 ::operator[]((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               *)(in_RDI + 0x18),(ulong)local_24);
        pvVar9 = std::
                 vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                 ::operator[](pvVar8,(ulong)local_28);
        Sym::symID(&pvVar9->val);
        psVar13 = local_50;
        TerminalFactory::remap_abi_cxx11_
                  (in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        std::operator<<(poVar5,psVar13);
        std::__cxx11::string::~string(local_50);
      }
      poVar5 = std::operator<<(local_10,"\"];");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_28 = local_28 + 1;
    }
    in_stack_ffffffffffffffa0 = 0;
    while( true ) {
      in_stack_ffffffffffffff40 =
           (shared_ptr<covenant::TerminalFactory> *)(ulong)in_stack_ffffffffffffffa0;
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 0x30),(ulong)local_24);
      psVar11 = (shared_ptr<covenant::TerminalFactory> *)
                std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (psVar11 <= in_stack_ffffffffffffff40) break;
      poVar5 = std::operator<<(local_10,"q");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_24);
      poVar5 = std::operator<<(poVar5," -> ");
      in_stack_ffffffffffffff38 = (DFA<covenant::Sym> *)std::operator<<(poVar5,"q");
      pvVar10 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 0x30),(ulong)local_24);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          (pvVar10,(ulong)in_stack_ffffffffffffffa0);
      poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff38,*pvVar12);
      poVar5 = std::operator<<(poVar5," [label=e];");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1;
    }
    local_24 = local_24 + 1;
  }
  poVar5 = std::operator<<(local_10,"}");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return local_10;
}

Assistant:

ostream& print_dot(ostream& o, string label) const
    {
      static unsigned int sfa_key=0;
      sfa_key++;
      o << "digraph " << "sfa_" << sfa_key << "{" << endl;
      o << "label = \"" << label << "\";" << endl;
      o << "rankdir=LR;" << endl;
      o << "node [shape = point ] qi;" << endl;
      for (int i=0; i < nStates() ; i++)
      {
        if (accepts[i])
          o << "node [shape = doublecircle ] " << "q" << i << ";" << endl;
        else
          o << "node [shape = circle ] " << "q" << i << ";" << endl;
      }
      o << "qi" << " -> " << "q" << startState().id << endl;
      for( unsigned int ss = 0; ss < trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < trans[ss].size(); ti++ )
        {
          o << "q" << ss << " -> " << "q" << trans[ss][ti].dest 
            << " [label=\"";
          if (trans[ss][ti].val.isVar ())
            o << trans[ss][ti].val; 
          else
            o << _tfac->remap (trans[ss][ti].val.symID ());
          o << "\"];" << endl;
        }
        for(unsigned int ei = 0; ei < eps[ss].size(); ei++)
        {
          o << "q" << ss << " -> " << "q" << eps[ss][ei] 
            << " [label=e];" << endl;
        }
      }
      o << "}" << endl;
      return o;
    }